

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O1

void VP8StoreFilterStats(VP8EncIterator *it)

{
  int iVar1;
  int iVar2;
  int iVar3;
  VP8Encoder *pVVar4;
  uint8_t *__dest;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  undefined1 uVar11;
  int iVar12;
  uint uVar13;
  double dVar14;
  
  uVar6 = *(byte *)it->mb >> 5 & 3;
  iVar1 = it->enc->dqm[uVar6].quant;
  if (((*(byte *)it->mb & 0x13) != 0x11) && (it->lf_stats != (LFStats *)0x0)) {
    iVar2 = it->enc->dqm[uVar6].fstrength;
    dVar14 = GetMBSSIM(it->yuv_in,it->yuv_out);
    *(double *)((long)(*it->lf_stats)[0] + (ulong)(uVar6 << 9)) =
         dVar14 + *(double *)((long)(*it->lf_stats)[0] + (ulong)(uVar6 << 9));
    if (-1 < iVar1) {
      iVar12 = -iVar1;
      iVar7 = (uint)(1 < iVar1) * 3 + 1;
      iVar9 = iVar2 * 2 + iVar1 * -2;
      do {
        if (0xffffffc0 < (iVar2 + iVar12) - 0x40U) {
          uVar10 = iVar2 + iVar12;
          pVVar4 = it->enc;
          iVar3 = pVVar4->config->filter_sharpness;
          uVar13 = uVar10;
          if (0 < iVar3) {
            uVar8 = uVar10 >> (4 < iVar3) + 1;
            uVar13 = 9U - iVar3;
            if ((int)uVar8 < (int)(9U - iVar3)) {
              uVar13 = uVar8;
            }
          }
          if ((int)uVar13 < 2) {
            uVar13 = 1;
          }
          iVar3 = uVar13 + iVar9;
          __dest = it->yuv_out2;
          memcpy(__dest,it->yuv_out,0x200);
          if ((pVVar4->filter_hdr).simple == 1) {
            (*VP8SimpleHFilter16i)(__dest,0x20,iVar3);
            (*VP8SimpleVFilter16i)(__dest,0x20,iVar3);
          }
          else {
            uVar11 = 0xe < (int)uVar10;
            if (0x27 < (int)uVar10) {
              uVar11 = 2;
            }
            iVar5 = (int)uVar11;
            (*VP8HFilter16i)(__dest,0x20,iVar3,uVar13,iVar5);
            (*VP8HFilter8i)(__dest + 0x10,__dest + 0x18,0x20,iVar3,uVar13,iVar5);
            (*VP8VFilter16i)(__dest,0x20,iVar3,uVar13,iVar5);
            (*VP8VFilter8i)(__dest + 0x10,__dest + 0x18,0x20,iVar3,uVar13,iVar5);
          }
          dVar14 = GetMBSSIM(it->yuv_in,it->yuv_out2);
          *(double *)((long)(*it->lf_stats)[0] + (ulong)uVar10 * 8 + (ulong)(uVar6 << 9)) =
               dVar14 + *(double *)
                         ((long)(*it->lf_stats)[0] + (ulong)uVar10 * 8 + (ulong)(uVar6 << 9));
        }
        iVar12 = iVar12 + iVar7;
        iVar9 = iVar9 + iVar7 * 2;
      } while (iVar12 <= iVar1);
    }
  }
  return;
}

Assistant:

void VP8StoreFilterStats(VP8EncIterator* const it) {
#if !defined(WEBP_REDUCE_SIZE)
  int d;
  VP8Encoder* const enc = it->enc;
  const int s = it->mb->segment;
  const int level0 = enc->dqm[s].fstrength;

  // explore +/-quant range of values around level0
  const int delta_min = -enc->dqm[s].quant;
  const int delta_max = enc->dqm[s].quant;
  const int step_size = (delta_max - delta_min >= 4) ? 4 : 1;

  if (it->lf_stats == NULL) return;

  // NOTE: Currently we are applying filter only across the sublock edges
  // There are two reasons for that.
  // 1. Applying filter on macro block edges will change the pixels in
  // the left and top macro blocks. That will be hard to restore
  // 2. Macro Blocks on the bottom and right are not yet compressed. So we
  // cannot apply filter on the right and bottom macro block edges.
  if (it->mb->type == 1 && it->mb->skip) return;

  // Always try filter level  zero
  (*it->lf_stats)[s][0] += GetMBSSIM(it->yuv_in, it->yuv_out);

  for (d = delta_min; d <= delta_max; d += step_size) {
    const int level = level0 + d;
    if (level <= 0 || level >= MAX_LF_LEVELS) {
      continue;
    }
    DoFilter(it, level);
    (*it->lf_stats)[s][level] += GetMBSSIM(it->yuv_in, it->yuv_out2);
  }
#else  // defined(WEBP_REDUCE_SIZE)
  (void)it;
#endif  // !defined(WEBP_REDUCE_SIZE)
}